

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_angle.cpp
# Opt level: O0

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              AngleUnitSystem angle_value_unit_system,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  int iVar1;
  double dVar2;
  double s;
  double dStack_40;
  int parsed_element_count;
  double x;
  AngleUnitSystem *pAStack_30;
  AngleUnitSystem parsed_angle_us;
  AngleUnitSystem *str_angle_unit_system_local;
  ON_ParseSettings *parse_results_local;
  double *angle_value_local;
  AngleUnitSystem angle_value_unit_system_local;
  wchar_t *pwStack_10;
  int str_count_local;
  wchar_t *str_local;
  
  x._7_1_ = None;
  dStack_40 = -1.23432101234321e+308;
  pAStack_30 = str_angle_unit_system;
  str_angle_unit_system_local = (AngleUnitSystem *)parse_results;
  parse_results_local = (ON_ParseSettings *)angle_value;
  angle_value_local._3_1_ = angle_value_unit_system;
  angle_value_local._4_4_ = str_count;
  pwStack_10 = str;
  iVar1 = ON_ParseAngleExpression
                    (str,str_count,parse_settings,&stack0xffffffffffffffc0,parse_results,
                     (AngleUnitSystem *)((long)&x + 7));
  if ((((0 < iVar1) && (x._7_1_ != angle_value_local._3_1_)) && (angle_value_local._3_1_ != None))
     && (x._7_1_ != None)) {
    dVar2 = ON::AngleUnitScale(x._7_1_,angle_value_local._3_1_);
    dStack_40 = dVar2 * dStack_40;
  }
  if (pAStack_30 != (AngleUnitSystem *)0x0) {
    *pAStack_30 = x._7_1_;
  }
  if (parse_results_local != (ON_ParseSettings *)0x0) {
    *(double *)parse_results_local->m_true_default_bits = dStack_40;
  }
  return iVar1;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  const ON::AngleUnitSystem angle_value_unit_system,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  ON::AngleUnitSystem parsed_angle_us = ON::AngleUnitSystem::None;

  double x = ON_UNSET_VALUE;
  int parsed_element_count = ON_ParseAngleExpression(
    str,
    str_count,
    parse_settings,
    &x,
    parse_results,
    &parsed_angle_us
    );

  if ( parsed_element_count > 0 )
  {
    if (    parsed_angle_us != angle_value_unit_system 
         && ON::AngleUnitSystem::None != angle_value_unit_system
         && ON::AngleUnitSystem::None != parsed_angle_us
         )
    {
      double s = ON::AngleUnitScale(parsed_angle_us,angle_value_unit_system);
      x *= s;
    }
  }

  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = parsed_angle_us;
  if ( 0 != angle_value )
    *angle_value = x;

  return parsed_element_count;
}